

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O0

void __thiscall json11::anon_unknown_21::JsonParser::consume_garbage(JsonParser *this)

{
  bool bVar1;
  bool comment_found;
  JsonParser *this_local;
  
  consume_whitespace(this);
  if (this->strategy == COMMENTS) {
    do {
      bVar1 = consume_comment(this);
      if ((this->failed & 1U) != 0) {
        return;
      }
      consume_whitespace(this);
    } while (bVar1);
  }
  return;
}

Assistant:

void consume_garbage() {
      consume_whitespace();
      if(strategy == JsonParse::COMMENTS) {
        bool comment_found = false;
        do {
          comment_found = consume_comment();
          if (failed) return;
          consume_whitespace();
        }
        while(comment_found);
      }
    }